

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::append(Value *this,Value *value)

{
  ushort uVar1;
  ValueHolder VVar2;
  ArrayIndex index;
  ValueHolder *pVVar3;
  ValueHolder local_30;
  ushort local_28;
  
  index = size(this);
  pVVar3 = &operator[](this,index)->value_;
  Value((Value *)&local_30,value);
  uVar1 = *(ushort *)(pVVar3 + 1);
  VVar2 = *pVVar3;
  *pVVar3 = local_30;
  *(ushort *)(pVVar3 + 1) = local_28 & 0x1ff | uVar1 & 0xfe00;
  local_28 = uVar1 & 0x1ff | local_28 & 0xfe00;
  local_30 = VVar2;
  ~Value((Value *)&local_30);
  return (Value *)pVVar3;
}

Assistant:

Value &
Value::append( const Value &value )
{
   return (*this)[size()] = value;
}